

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_api.c
# Opt level: O0

char * amqp_error_string2(int code)

{
  char cVar2;
  ulong uVar1;
  size_t error;
  size_t category;
  char *error_string;
  int code_local;
  
  cVar2 = (char)((uint)-code >> 8);
  uVar1 = (ulong)(-code & 0xff);
  if (cVar2 == '\0') {
    if (uVar1 < 0x15) {
      error_string = base_error_strings[uVar1];
    }
    else {
      error_string = unknown_error_string;
    }
  }
  else if (cVar2 == '\x01') {
    if (uVar1 < 2) {
      error_string = tcp_error_strings[uVar1];
    }
    else {
      error_string = unknown_error_string;
    }
  }
  else if (cVar2 == '\x02') {
    if (uVar1 < 6) {
      error_string = ssl_error_strings[uVar1];
    }
    else {
      error_string = unknown_error_string;
    }
  }
  else {
    error_string = unknown_error_string;
  }
  return error_string;
}

Assistant:

const char *amqp_error_string2(int code) {
  const char *error_string;
  size_t category = (((-code) & ERROR_CATEGORY_MASK) >> 8);
  size_t error = (-code) & ERROR_MASK;

  switch (category) {
    case EC_base:
      if (error < (sizeof(base_error_strings) / sizeof(char *))) {
        error_string = base_error_strings[error];
      } else {
        error_string = unknown_error_string;
      }
      break;

    case EC_tcp:
      if (error < (sizeof(tcp_error_strings) / sizeof(char *))) {
        error_string = tcp_error_strings[error];
      } else {
        error_string = unknown_error_string;
      }
      break;

    case EC_ssl:
      if (error < (sizeof(ssl_error_strings) / sizeof(char *))) {
        error_string = ssl_error_strings[error];
      } else {
        error_string = unknown_error_string;
      }

      break;

    default:
      error_string = unknown_error_string;
      break;
  }

  return error_string;
}